

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_jp2_t * jp2_create_decompress(opj_common_ptr cinfo)

{
  opj_jp2_t *jp2;
  opj_j2k_t *poVar1;
  
  jp2 = (opj_jp2_t *)calloc(1,0x68);
  if (jp2 != (opj_jp2_t *)0x0) {
    jp2->cinfo = cinfo;
    poVar1 = j2k_create_decompress(cinfo);
    jp2->j2k = poVar1;
    if (poVar1 == (opj_j2k_t *)0x0) {
      jp2_destroy_decompress(jp2);
      jp2 = (opj_jp2_t *)0x0;
    }
  }
  return jp2;
}

Assistant:

opj_jp2_t* jp2_create_decompress(opj_common_ptr cinfo) {
	opj_jp2_t *jp2 = (opj_jp2_t*) opj_calloc(1, sizeof(opj_jp2_t));
	if(jp2) {
		jp2->cinfo = cinfo;
		/* create the J2K codec */
		jp2->j2k = j2k_create_decompress(cinfo);
		if(jp2->j2k == NULL) {
			jp2_destroy_decompress(jp2);
			return NULL;
		}
	}
	return jp2;
}